

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O1

int h264_intra_chroma_pred_mode(bitstream *str,h264_cabac_context *cabac,uint32_t *val)

{
  uint32_t uVar1;
  int iVar2;
  h264_macroblock *phVar3;
  int ctxIdx [2];
  int local_28;
  undefined4 local_24;
  
  if (cabac != (h264_cabac_context *)0x0) {
    phVar3 = h264_mb_nb(cabac->slice,H264_MB_A,0);
    uVar1 = phVar3->intra_chroma_pred_mode;
    phVar3 = h264_mb_nb(cabac->slice,H264_MB_B,0);
    _local_28 = CONCAT44(0x43,(0x42 - (uint)(uVar1 == 0)) -
                              (uint)(phVar3->intra_chroma_pred_mode == 0));
    iVar2 = h264_cabac_tu(str,cabac,&local_28,2,3,val);
    return iVar2;
  }
  iVar2 = vs_ue(str,val);
  return iVar2;
}

Assistant:

int h264_intra_chroma_pred_mode(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *val) {
	if (!cabac)
		return vs_ue(str, val);
	int ctxIdx[2];
	int condTermFlagA = h264_mb_nb(cabac->slice, H264_MB_A, 0)->intra_chroma_pred_mode != 0;
	int condTermFlagB = h264_mb_nb(cabac->slice, H264_MB_B, 0)->intra_chroma_pred_mode != 0;
	ctxIdx[0] = H264_CABAC_CTXIDX_INTRA_CHROMA_PRED_MODE + condTermFlagA + condTermFlagB;
	ctxIdx[1] = H264_CABAC_CTXIDX_INTRA_CHROMA_PRED_MODE + 3;
	return h264_cabac_tu(str, cabac, ctxIdx, 2, 3, val);
}